

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_fma::create_pipeline(ConvolutionDepthWise_x86_fma *this,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar7;
  int *piVar5;
  Allocator *pAVar6;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  Layer *pLVar11;
  int iVar12;
  undefined1 auVar13 [16];
  ParamDict pd;
  Allocator *local_48;
  
  if ((this->super_ConvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  switch((this->super_ConvolutionDepthWise).activation_type) {
  case 1:
    pLVar11 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 2:
    pLVar11 = create_layer_cpu(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 3:
    pLVar11 = create_layer_cpu(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data
                                   + 4));
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 4:
    pLVar11 = create_layer_cpu(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 5:
    pLVar11 = create_layer_cpu(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  case 6:
    pLVar11 = create_layer_cpu(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,*(this->super_ConvolutionDepthWise).activation_params.data);
    ParamDict::set(&pd,1,*(float *)((long)(this->super_ConvolutionDepthWise).activation_params.data
                                   + 4));
    (*pLVar11->_vptr_Layer[2])(pLVar11,&pd);
    break;
  default:
    pLVar11 = (Layer *)0x0;
    goto LAB_003b3666;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar11->_vptr_Layer[4])(pLVar11,opt);
LAB_003b3666:
  this->activation = pLVar11;
  if ((opt->use_int8_inference == true) &&
     ((this->super_ConvolutionDepthWise).weight_data.elemsize == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar4 = (this->super_ConvolutionDepthWise).kernel_w;
  uVar7 = (this->super_ConvolutionDepthWise).kernel_h;
  auVar13._4_4_ = uVar7;
  auVar13._0_4_ = uVar4;
  iVar12 = uVar7 * uVar4;
  uVar10 = (this->super_ConvolutionDepthWise).group;
  uVar8 = (long)(this->super_ConvolutionDepthWise).weight_data_size / (long)(int)uVar10;
  uVar8 = (long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) / (long)iVar12;
  uVar2 = (this->super_ConvolutionDepthWise).num_output;
  if ((uVar10 == uVar2) &&
     ((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
           (long)((int)uVar2 / (int)uVar10)) * uVar10 == uVar10)) {
    if (opt->use_packing_layout == true) {
      if ((uVar10 & 7) == 0) {
        Mat::reshape((Mat *)&pd,&(this->super_ConvolutionDepthWise).weight_data,iVar12,uVar10,
                     (Allocator *)0x0);
        convert_packing((Mat *)&pd,&this->weight_data_tm,8,opt);
        if (pd.d == (ParamDictPrivate *)0x0) goto LAB_003b38d2;
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type != 0) goto LAB_003b38d2;
        if (local_48 != (Allocator *)0x0) {
          (*local_48->_vptr_Allocator[3])();
          goto LAB_003b38d2;
        }
      }
      else {
        if ((uVar10 & 3) != 0) goto LAB_003b36f5;
        Mat::reshape((Mat *)&pd,&(this->super_ConvolutionDepthWise).weight_data,iVar12,uVar10,
                     (Allocator *)0x0);
        convert_packing((Mat *)&pd,&this->weight_data_tm,4,opt);
        if (pd.d == (ParamDictPrivate *)0x0) goto LAB_003b38d2;
        LOCK();
        (pd.d)->params[0].type = (pd.d)->params[0].type + -1;
        UNLOCK();
        if ((pd.d)->params[0].type != 0) goto LAB_003b38d2;
        if (local_48 != (Allocator *)0x0) {
          (*local_48->_vptr_Allocator[3])();
          goto LAB_003b38d2;
        }
      }
      free(pd._vptr_ParamDict);
      goto LAB_003b38d2;
    }
LAB_003b36f5:
    auVar1._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
    auVar1._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
    auVar1._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
    auVar1._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
    auVar13._8_8_ = 0;
    auVar13 = vpunpcklqdq_avx(auVar13,auVar1);
    auVar13 = vpcmpeqd_avx(auVar13,_DAT_005455c0);
    uVar10 = vmovmskps_avx(auVar13);
    iVar12 = (this->super_ConvolutionDepthWise).stride_w;
    iVar3 = (this->super_ConvolutionDepthWise).stride_h;
    if ((iVar3 == 1 && (iVar12 == 1 && (uVar10 ^ 0xf) == 0)) ||
       ((iVar3 == 2 && iVar12 == 2) && (char)(uVar10 ^ 0xf) == '\0')) {
      piVar5 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      piVar5 = (this->weight_data_tm).refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          pAVar6 = (this->weight_data_tm).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      piVar5 = (this->super_ConvolutionDepthWise).weight_data.refcount;
      (this->weight_data_tm).data = (this->super_ConvolutionDepthWise).weight_data.data;
      (this->weight_data_tm).refcount = piVar5;
      (this->weight_data_tm).elemsize = (this->super_ConvolutionDepthWise).weight_data.elemsize;
      (this->weight_data_tm).elempack = (this->super_ConvolutionDepthWise).weight_data.elempack;
      (this->weight_data_tm).allocator = (this->super_ConvolutionDepthWise).weight_data.allocator;
      iVar12 = (this->super_ConvolutionDepthWise).weight_data.w;
      iVar3 = (this->super_ConvolutionDepthWise).weight_data.h;
      iVar9 = (this->super_ConvolutionDepthWise).weight_data.d;
      (this->weight_data_tm).dims = (this->super_ConvolutionDepthWise).weight_data.dims;
      (this->weight_data_tm).w = iVar12;
      (this->weight_data_tm).h = iVar3;
      (this->weight_data_tm).d = iVar9;
      (this->weight_data_tm).c = (this->super_ConvolutionDepthWise).weight_data.c;
      (this->weight_data_tm).cstep = (this->super_ConvolutionDepthWise).weight_data.cstep;
      goto LAB_003b38d2;
    }
  }
  create_group_ops(this,opt);
LAB_003b38d2:
  if (opt->lightmode == true) {
    piVar5 = (this->super_ConvolutionDepthWise).weight_data.refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        pAVar6 = (this->super_ConvolutionDepthWise).weight_data.allocator;
        if (pAVar6 == (Allocator *)0x0) {
          free((this->super_ConvolutionDepthWise).weight_data.data);
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_ConvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_ConvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_ConvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_ConvolutionDepthWise).weight_data.dims = 0;
    (this->super_ConvolutionDepthWise).weight_data.w = 0;
    (this->super_ConvolutionDepthWise).weight_data.h = 0;
    (this->super_ConvolutionDepthWise).weight_data.d = 0;
    (this->super_ConvolutionDepthWise).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}